

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_comp(ASMState *as,IRIns *ir)

{
  char cVar1;
  ushort uVar2;
  MCode *pMVar3;
  IRIns *pIVar4;
  byte bVar5;
  uint uVar6;
  IRRef ref;
  ushort uVar7;
  int iVar8;
  Reg rb;
  Reg RVar9;
  MCode *pMVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  x86Op xo;
  anon_struct_8_5_4e98db7e_for_IRIns_2 aVar14;
  uint uVar15;
  RegSet allow;
  IRIns *pIVar16;
  byte bVar17;
  Reg RVar18;
  bool bVar19;
  bool bVar20;
  uint local_4c;
  IRIns *local_48;
  uint local_3c;
  anon_struct_8_5_4e98db7e_for_IRIns_2 local_38;
  
  uVar15 = (uint)asm_compmap[(ir->field_1).o];
  uVar13 = (ir->field_1).t.irt & 0x1f;
  uVar12 = (ir->field_0).op2;
  if (uVar13 == 0xe) {
    bVar19 = (asm_compmap[(ir->field_1).o] >> 0xe & 1) == 0;
    uVar13 = (uint)uVar12;
    ref = (uint)(ir->field_0).op1;
    if (bVar19) {
      uVar13 = (uint)(ir->field_0).op1;
      ref = (uint)uVar12;
    }
    uVar6 = uVar15 ^ 0x6050;
    if (bVar19) {
      uVar6 = uVar15;
    }
    cVar1 = *(char *)((long)as->ir + (ulong)uVar13 * 8 + 6);
    RVar18 = (Reg)cVar1;
    if (cVar1 < '\0') {
      RVar18 = ra_allocref(as,uVar13,0xffff0000);
    }
    bVar5 = (byte)RVar18 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
    pMVar3 = as->mcp;
    asm_guardcc(as,uVar6 >> 4);
    if ((uVar6 >> 0xd & 1) == 0) goto LAB_0014382c;
    if ((uVar6 >> 0xc & 1) == 0) {
      asm_guardcc(as,10);
      goto LAB_0014382c;
    }
    if (pMVar3 == as->invmcp) {
      as->loopinv = 2;
      pMVar10 = as->mcp;
      if (as->realign != (MCode *)0x0) {
        pMVar10[-2] = 'z';
        pMVar10[-1] = '\0';
        goto LAB_00143821;
      }
      pMVar10[-4] = '\0';
      pMVar10[-3] = '\0';
      pMVar10[-2] = '\0';
      pMVar10[-1] = '\0';
      pMVar10[-6] = '\x0f';
      pMVar10[-5] = 0x8a;
      pMVar10 = pMVar10 + -6;
    }
    else {
      pMVar10 = as->mcp;
      pMVar10[-1] = (char)pMVar3 - (char)pMVar10;
      pMVar10[-2] = 'z';
LAB_00143821:
      pMVar10 = pMVar10 + -2;
    }
    as->mcp = pMVar10;
LAB_0014382c:
    RVar9 = asm_fuseload(as,ref,~(1 << ((byte)RVar18 & 0x1f)) & 0xffff0000);
    emit_mrm(as,XO_UCOMISD,RVar18,RVar9);
    return;
  }
  uVar2 = (ir->field_0).op1;
  pIVar4 = as->ir;
  if ((-1 < (short)uVar2) ||
     ((uVar7 = uVar2, (short)uVar12 < 0 &&
      ((byte)(*(char *)((long)pIVar4 + (ulong)uVar2 * 8 + 5) + 0xbeU) < 7)))) {
    uVar7 = uVar12;
    uVar12 = uVar2;
    if ((~uVar15 & 0xc) == 0) {
      uVar15 = uVar15 ^ 0x53;
    }
    else if ((uVar15 & 10) == 2) {
      uVar15 = uVar15 ^ 0x55;
    }
  }
  RVar18 = -(uint)((0x605fd9U >> uVar13 & 1) != 0) & 0x80200;
  if ((short)uVar12 < 0) {
LAB_00143773:
    cVar1 = *(char *)((long)pIVar4 + (ulong)uVar7 * 8 + 6);
    RVar9 = (Reg)cVar1;
    if (cVar1 < '\0') {
      RVar9 = ra_allocref(as,(uint)uVar7,0xbfef);
    }
    bVar5 = (byte)RVar9 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
    rb = asm_fuseloadm(as,(uint)uVar12,~(1 << (RVar9 & 0x1f)) & 0xbfef,RVar18);
    asm_guardcc(as,uVar15);
    xo = XO_CMP;
LAB_001437cd:
    RVar18 = RVar9 | RVar18;
    goto LAB_00143979;
  }
  uVar11 = (ulong)(uint)uVar12;
  if ((*(char *)((long)pIVar4 + uVar11 * 8 + 5) == '\x1b') ||
     ((0x605fd9U >> (*(uint *)((long)pIVar4 + uVar11 * 8 + 4) & 0x1f) & 1) == 0)) {
    aVar14.t.irt = '\0';
    aVar14.o = '\0';
    aVar14.r = '\0';
    aVar14.s = '\0';
    aVar14.op12 = pIVar4[uVar11].field_1.op12;
  }
  else {
    aVar14 = pIVar4[uVar11 + 1].field_1;
    if ((anon_struct_8_5_4e98db7e_for_IRIns_2)(long)(int)aVar14.op12 != aVar14) goto LAB_00143773;
  }
  local_4c = aVar14.op12;
  pIVar16 = pIVar4 + uVar7;
  bVar19 = local_4c == 0;
  bVar20 = (uVar15 & 10) != 2;
  local_48 = pIVar16;
  local_38 = aVar14;
  if ((bVar20 && bVar19) && (pIVar16 + 1 == ir && (pIVar16->field_1).o == '!')) {
    if ((-1 < (char)(pIVar16->field_1).r) || ((pIVar16->field_1).s != '\0')) goto LAB_0014388d;
    uVar12 = (pIVar16->field_0).op2;
    iVar8 = asm_isk32(as,(uint)uVar12,(int32_t *)&local_4c);
    if (iVar8 == 0) {
      RVar9 = ra_alloc1(as,(uint)uVar12,0xbfef);
      allow = ~(1 << (RVar9 & 0x1f)) & 0xbfef;
LAB_001439aa:
      as->curins = as->curins - 1;
      rb = asm_fuseloadm(as,(uint)(local_48->field_0).op1,allow,RVar18);
      as->curins = as->curins + 1;
      asm_guardcc(as,uVar15);
      if (RVar9 < 0x80) {
        xo = XO_TEST;
        goto LAB_001437cd;
      }
    }
    else {
      uVar11 = (ulong)(pIVar16->field_0).op1;
      allow = 0xbfef;
      RVar9 = 0x80;
      if ((6 < (byte)(*(char *)((long)pIVar4 + uVar11 * 8 + 5) + 0xbeU)) ||
         (bVar5 = *(byte *)((long)pIVar4 + uVar11 * 8 + 4), 1 < (byte)((bVar5 & 0x1f) - 0xf)))
      goto LAB_001439aa;
      *(byte *)((long)pIVar4 + uVar11 * 8 + 4) = bVar5 & 0xe0 | 0x13;
      as->curins = as->curins - 1;
      rb = asm_fuseload(as,(uint)(local_48->field_0).op1,0xbfef);
      as->curins = as->curins + 1;
      *(byte *)((long)pIVar4 + uVar11 * 8 + 4) = bVar5;
      asm_guardcc(as,uVar15);
      if (rb == 0x20) {
        pMVar3 = as->mcp;
        as->mcp = pMVar3 + -1;
        pMVar3[-1] = (MCode)local_4c;
        xo = XO_GROUP3b;
        RVar18 = 0;
        goto LAB_00143726;
      }
    }
    pMVar3 = as->mcp;
    *(uint *)(pMVar3 + -4) = local_4c;
    as->mcp = pMVar3 + -4;
    xo = XO_GROUP3;
    goto LAB_00143979;
  }
  if ((byte)((pIVar16->field_1).o + 0xbe) < 7) {
    bVar5 = (byte)(pIVar16->field_0).ot;
    bVar17 = bVar5 & 0x1f;
    if ((0xff < local_4c) || (bVar17 != 0x10)) {
      if (bVar17 == 0xf) {
LAB_001437ef:
        if ((int)(char)aVar14.op12 == local_4c) goto LAB_0014369f;
      }
      else if (bVar17 == 0x12) {
        if ((local_4c < 0x10000) && ((int)(short)aVar14.op12 == (int)(char)aVar14.op12))
        goto LAB_0014369f;
      }
      else if (bVar17 == 0x11) goto LAB_001437ef;
      goto LAB_0014388d;
    }
LAB_0014369f:
    (pIVar16->field_1).t.irt = bVar5 & 0xe0 | 0x13;
    local_3c = (uint)bVar5;
    RVar9 = asm_fuseload(as,(uint)uVar7,0xbfef);
    (pIVar16->field_1).t.irt = (uint8_t)local_3c;
    if (RVar9 == 0x20) {
      if ((bVar17 | 2) == 0x12) {
        uVar15 = uVar15 >> 4;
      }
      asm_guardcc(as,uVar15);
      pMVar3 = as->mcp;
      as->mcp = pMVar3 + -1;
      pMVar3[-1] = (MCode)local_38.op12;
      xo = XO_ARITHiw8;
      if ((byte)(bVar17 - 0xf) < 2) {
        xo = XO_ARITHib;
      }
      RVar18 = RVar18 | 7;
LAB_00143726:
      rb = 0x20;
      goto LAB_00143979;
    }
  }
  else {
LAB_0014388d:
    RVar9 = asm_fuseloadm(as,(uint)uVar7,0xbfef,RVar18);
  }
  asm_guardcc(as,uVar15);
  if ((bVar20 && bVar19) && RVar9 != 0x20) {
    bVar19 = ((ir->field_1).t.irt & 0x1f) != 0x10;
    uVar15 = 0;
    if (!bVar19) {
      uVar15 = ~(0x1e00U >> ((byte)RVar9 & 0x1f)) & 0x200;
    }
    emit_rr(as,(uint)bVar19 << 0x18 | XO_TESTb,RVar18 + (uVar15 | RVar9),uVar15 | RVar9);
    if (local_48 + 1 != ir) {
      return;
    }
    as->flagmcp = as->mcp;
    return;
  }
  uVar15 = RVar9 + RVar18;
  if ((int)(char)(MCode)local_38.op12 == local_38.op12) {
    pMVar3 = as->mcp;
    as->mcp = pMVar3 + -1;
    pMVar3[-1] = (MCode)local_38.op12;
    xo = XO_ARITHi8;
  }
  else {
    pMVar3 = as->mcp;
    *(IRRef2 *)(pMVar3 + -4) = local_38.op12;
    as->mcp = pMVar3 + -4;
    xo = XO_ARITHi;
  }
  RVar18 = uVar15 & 0x80200 | 7;
  rb = uVar15 & 0xfff7fdff;
LAB_00143979:
  emit_mrm(as,xo,RVar18,rb);
  return;
}

Assistant:

static void asm_comp(ASMState *as, IRIns *ir)
{
  uint32_t cc = asm_compmap[ir->o];
  if (irt_isnum(ir->t)) {
    IRRef lref = ir->op1;
    IRRef rref = ir->op2;
    Reg left, right;
    MCLabel l_around;
    /*
    ** An extra CC_P branch is required to preserve ordered/unordered
    ** semantics for FP comparisons. This can be avoided by swapping
    ** the operands and inverting the condition (except for EQ and UNE).
    ** So always try to swap if possible.
    **
    ** Another option would be to swap operands to achieve better memory
    ** operand fusion. But it's unlikely that this outweighs the cost
    ** of the extra branches.
    */
    if (cc & VCC_S) {  /* Swap? */
      IRRef tmp = lref; lref = rref; rref = tmp;
      cc ^= (VCC_PS|(5<<4));  /* A <-> B, AE <-> BE, PS <-> none */
    }
    left = ra_alloc1(as, lref, RSET_FPR);
    l_around = emit_label(as);
    asm_guardcc(as, cc >> 4);
    if (cc & VCC_P) {  /* Extra CC_P branch required? */
      if (!(cc & VCC_U)) {
	asm_guardcc(as, CC_P);  /* Branch to exit for ordered comparisons. */
      } else if (l_around != as->invmcp) {
	emit_sjcc(as, CC_P, l_around);  /* Branch around for unordered. */
      } else {
	/* Patched to mcloop by asm_loop_fixup. */
	as->loopinv = 2;
	if (as->realign)
	  emit_sjcc(as, CC_P, as->mcp);
	else
	  emit_jcc(as, CC_P, as->mcp);
      }
    }
    right = asm_fuseload(as, rref, rset_exclude(RSET_FPR, left));
    emit_mrm(as, XO_UCOMISD, left, right);
  } else {
    IRRef lref = ir->op1, rref = ir->op2;
    IROp leftop = (IROp)(IR(lref)->o);
    Reg r64 = REX_64IR(ir, 0);
    int32_t imm = 0;
    lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) ||
	       irt_isu32(ir->t) || irt_isaddr(ir->t) || irt_isu8(ir->t),
	       "bad comparison data type %d", irt_type(ir->t));
    /* Swap constants (only for ABC) and fusable loads to the right. */
    if (irref_isk(lref) || (!irref_isk(rref) && opisfusableload(leftop))) {
      if ((cc & 0xc) == 0xc) cc ^= 0x53;  /* L <-> G, LE <-> GE */
      else if ((cc & 0xa) == 0x2) cc ^= 0x55;  /* A <-> B, AE <-> BE */
      lref = ir->op2; rref = ir->op1;
    }
    if (asm_isk32(as, rref, &imm)) {
      IRIns *irl = IR(lref);
      /* Check wether we can use test ins. Not for unsigned, since CF=0. */
      int usetest = (imm == 0 && (cc & 0xa) != 0x2);
      if (usetest && irl->o == IR_BAND && irl+1 == ir && !ra_used(irl)) {
	/* Combine comp(BAND(ref, r/imm), 0) into test mrm, r/imm. */
	Reg right, left = RID_NONE;
	RegSet allow = RSET_GPR;
	if (!asm_isk32(as, irl->op2, &imm)) {
	  left = ra_alloc1(as, irl->op2, allow);
	  rset_clear(allow, left);
	} else {  /* Try to Fuse IRT_I8/IRT_U8 loads, too. See below. */
	  IRIns *irll = IR(irl->op1);
	  if (opisfusableload((IROp)irll->o) &&
	      (irt_isi8(irll->t) || irt_isu8(irll->t))) {
	    IRType1 origt = irll->t;  /* Temporarily flip types. */
	    irll->t.irt = (irll->t.irt & ~IRT_TYPE) | IRT_INT;
	    as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	    right = asm_fuseload(as, irl->op1, RSET_GPR);
	    as->curins++;
	    irll->t = origt;
	    if (right != RID_MRM) goto test_nofuse;
	    /* Fusion succeeded, emit test byte mrm, imm8. */
	    asm_guardcc(as, cc);
	    emit_i8(as, (imm & 0xff));
	    emit_mrm(as, XO_GROUP3b, XOg_TEST, RID_MRM);
	    return;
	  }
	}
	as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	right = asm_fuseloadm(as, irl->op1, allow, r64);
	as->curins++;  /* Undo the above. */
      test_nofuse:
	asm_guardcc(as, cc);
	if (ra_noreg(left)) {
	  emit_i32(as, imm);
	  emit_mrm(as, XO_GROUP3, r64 + XOg_TEST, right);
	} else {
	  emit_mrm(as, XO_TEST, r64 + left, right);
	}
      } else {
	Reg left;
	if (opisfusableload((IROp)irl->o) &&
	    ((irt_isu8(irl->t) && checku8(imm)) ||
	     ((irt_isi8(irl->t) || irt_isi16(irl->t)) && checki8(imm)) ||
	     (irt_isu16(irl->t) && checku16(imm) && checki8((int16_t)imm)))) {
	  /* Only the IRT_INT case is fused by asm_fuseload.
	  ** The IRT_I8/IRT_U8 loads and some IRT_I16/IRT_U16 loads
	  ** are handled here.
	  ** Note that cmp word [mem], imm16 should not be generated,
	  ** since it has a length-changing prefix. Compares of a word
	  ** against a sign-extended imm8 are ok, however.
	  */
	  IRType1 origt = irl->t;  /* Temporarily flip types. */
	  irl->t.irt = (irl->t.irt & ~IRT_TYPE) | IRT_INT;
	  left = asm_fuseload(as, lref, RSET_GPR);
	  irl->t = origt;
	  if (left == RID_MRM) {  /* Fusion succeeded? */
	    if (irt_isu8(irl->t) || irt_isu16(irl->t))
	      cc >>= 4;  /* Need unsigned compare. */
	    asm_guardcc(as, cc);
	    emit_i8(as, imm);
	    emit_mrm(as, (irt_isi8(origt) || irt_isu8(origt)) ?
			 XO_ARITHib : XO_ARITHiw8, r64 + XOg_CMP, RID_MRM);
	    return;
	  }  /* Otherwise handle register case as usual. */
	} else {
	  left = asm_fuseloadm(as, lref,
			       irt_isu8(ir->t) ? RSET_GPR8 : RSET_GPR, r64);
	}
	asm_guardcc(as, cc);
	if (usetest && left != RID_MRM) {
	  /* Use test r,r instead of cmp r,0. */
	  x86Op xo = XO_TEST;
	  if (irt_isu8(ir->t)) {
	    lj_assertA(ir->o == IR_EQ || ir->o == IR_NE, "bad usage");
	    xo = XO_TESTb;
	    if (!rset_test(RSET_RANGE(RID_EAX, RID_EBX+1), left)) {
	      if (LJ_64) {
		left |= FORCE_REX;
	      } else {
		emit_i32(as, 0xff);
		emit_mrm(as, XO_GROUP3, XOg_TEST, left);
		return;
	      }
	    }
	  }
	  emit_rr(as, xo, r64 + left, left);
	  if (irl+1 == ir)  /* Referencing previous ins? */
	    as->flagmcp = as->mcp;  /* Set flag to drop test r,r if possible. */
	} else {
	  emit_gmrmi(as, XG_ARITHi(XOg_CMP), r64 + left, imm);
	}
      }
    } else {
      Reg left = ra_alloc1(as, lref, RSET_GPR);
      Reg right = asm_fuseloadm(as, rref, rset_exclude(RSET_GPR, left), r64);
      asm_guardcc(as, cc);
      emit_mrm(as, XO_CMP, r64 + left, right);
    }
  }
}